

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_> *this_00;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  value_type vVar6;
  value_type vVar7;
  double dVar8;
  
  vVar6 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::dx
                    (&this->left_->fadexpr_,i);
  this_00 = &this->right_->fadexpr_;
  dVar1 = this_00->left_->val_;
  dVar2 = ((this_00->right_->fadexpr_).left_)->val_;
  dVar3 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar7 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>::dx
                    (this_00,i);
  pFVar4 = (this->left_->fadexpr_).right_;
  pFVar5 = (this->right_->fadexpr_).right_;
  dVar8 = ((this->right_->fadexpr_).left_)->val_ -
          ((pFVar5->fadexpr_).left_)->val_ * ((pFVar5->fadexpr_).right_)->val_;
  return ((dVar1 - dVar2 * dVar3) * vVar6 -
         (((this->left_->fadexpr_).left_)->val_ /
         (((pFVar4->fadexpr_).left_)->val_ + ((pFVar4->fadexpr_).right_)->val_)) * vVar7) /
         (dVar8 * dVar8);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}